

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_regions.cpp
# Opt level: O0

void __thiscall
Am_Region_Impl::Union(Am_Region_Impl *this,int the_left,int the_top,uint the_width,uint the_height)

{
  value_type p_Var1;
  bool bVar2;
  reference pp_Var3;
  undefined2 local_30;
  undefined2 local_2e;
  undefined2 local_2c;
  undefined2 local_2a;
  XRectangle x_rect;
  uint the_height_local;
  uint the_width_local;
  int the_top_local;
  int the_left_local;
  Am_Region_Impl *this_local;
  
  bVar2 = std::stack<_XRegion_*,_std::deque<_XRegion_*,_std::allocator<_XRegion_*>_>_>::empty
                    (&this->stack);
  if (bVar2) {
    x_rect = (XRectangle)XCreateRegion();
    std::stack<_XRegion_*,_std::deque<_XRegion_*,_std::allocator<_XRegion_*>_>_>::push
              (&this->stack,(value_type *)&x_rect);
  }
  local_30 = (undefined2)the_left;
  local_2e = (undefined2)the_top;
  local_2c = (undefined2)the_width;
  local_2a = (undefined2)the_height;
  pp_Var3 = std::stack<_XRegion_*,_std::deque<_XRegion_*,_std::allocator<_XRegion_*>_>_>::top
                      (&this->stack);
  p_Var1 = *pp_Var3;
  pp_Var3 = std::stack<_XRegion_*,_std::deque<_XRegion_*,_std::allocator<_XRegion_*>_>_>::top
                      (&this->stack);
  XUnionRectWithRegion(&local_30,p_Var1,*pp_Var3);
  return;
}

Assistant:

void
Am_Region_Impl::Union(int the_left, int the_top, unsigned int the_width,
                      unsigned int the_height)
{
  // Create a new region for top if needed
  if (stack.empty()) {
    stack.push(XCreateRegion());
  }
  // Set up a rectangle
  XRectangle x_rect; // was static ???
  x_rect.x = the_left;
  x_rect.y = the_top;
  x_rect.width = the_width;
  x_rect.height = the_height;
  // Does the union
  XUnionRectWithRegion(&x_rect, stack.top(), stack.top());
}